

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O2

void Bus_SclInsertFanout(Vec_Ptr_t *vFanouts,Abc_Obj_t *pObj)

{
  ulong uVar1;
  void *pvVar2;
  void **ppvVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint i;
  Abc_Obj_t *pCur;
  Abc_Obj_t *local_38;
  
  i = 0;
  for (iVar4 = 0; iVar4 < vFanouts->nSize; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(vFanouts,iVar4);
    if (pvVar2 != (void *)0x0) {
      pvVar2 = Vec_PtrEntry(vFanouts,iVar4);
      Vec_PtrWriteEntry(vFanouts,i,pvVar2);
      i = i + 1;
    }
  }
  if ((int)i <= vFanouts->nSize) {
    vFanouts->nSize = i;
    if (i == vFanouts->nCap) {
      uVar5 = 0x10;
      if (0xf < (int)i) {
        uVar5 = i * 2;
      }
      if ((int)i < (int)uVar5) {
        if (vFanouts->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar5 << 3);
        }
        else {
          ppvVar3 = (void **)realloc(vFanouts->pArray,(ulong)uVar5 << 3);
          i = vFanouts->nSize;
        }
        vFanouts->pArray = ppvVar3;
        vFanouts->nCap = uVar5;
      }
    }
    vFanouts->nSize = i + 1;
    vFanouts->pArray[(int)i] = pObj;
    uVar6 = (ulong)i;
    while( true ) {
      if ((int)uVar6 + 1 < 2) {
        return;
      }
      uVar1 = uVar6 - 1;
      pCur = (Abc_Obj_t *)Vec_PtrEntry(vFanouts,(int)uVar1);
      local_38 = (Abc_Obj_t *)Vec_PtrEntry(vFanouts,(int)uVar6);
      iVar4 = Bus_SclCompareFanouts(&pCur,&local_38);
      if (iVar4 == -1) break;
      ppvVar3 = vFanouts->pArray;
      pvVar2 = ppvVar3[uVar1 & 0xffffffff];
      ppvVar3[uVar1 & 0xffffffff] = ppvVar3[uVar6];
      vFanouts->pArray[uVar6] = pvVar2;
      uVar6 = uVar1;
    }
    return;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
}

Assistant:

void Bus_SclInsertFanout( Vec_Ptr_t * vFanouts, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pCur;
    int i, k;
    // compact array
    for ( i = k = 0; i < Vec_PtrSize(vFanouts); i++ )
        if ( Vec_PtrEntry(vFanouts, i) != NULL )
            Vec_PtrWriteEntry( vFanouts, k++, Vec_PtrEntry(vFanouts, i) );
    Vec_PtrShrink( vFanouts, k );
    // insert new entry
    Vec_PtrPush( vFanouts, pObj );
    for ( i = Vec_PtrSize(vFanouts) - 1; i > 0; i-- )
    {
        pCur = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, i-1);
        pObj = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, i);
        if ( Bus_SclCompareFanouts( &pCur, &pObj ) == -1 )
            break;
        ABC_SWAP( void *, Vec_PtrArray(vFanouts)[i-1], Vec_PtrArray(vFanouts)[i] );
    }
}